

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O1

apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *self)

{
  uint8_t **ppuVar1;
  uint uVar2;
  apx_vm_writeState_t *paVar3;
  uint8_t *p;
  apx_error_t aVar4;
  uint8_t uVar5;
  uint32_t value;
  uint64_t value_00;
  
  paVar3 = self->state;
  p = (self->buffer).next;
  uVar2 = paVar3->element_size;
  if ((self->buffer).end < p + uVar2) {
    return 0x25;
  }
  aVar4 = 10;
  switch(paVar3->type_code) {
  case '\x01':
    if (paVar3->scalar_storage_type != '\x02') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6c1,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 1) {
      __assert_fail("self->state->element_size == UINT8_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6c2,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    break;
  case '\x02':
    if (paVar3->scalar_storage_type != '\x02') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6c6,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 2) {
      __assert_fail("self->state->element_size == UINT16_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6c7,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    goto LAB_00135eb9;
  case '\x03':
    if (paVar3->scalar_storage_type != '\x02') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6cb,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 4) {
      __assert_fail("self->state->element_size == UINT32_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6cc,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    goto LAB_00135ed9;
  case '\x04':
    if (paVar3->scalar_storage_type != '\x04') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6d0,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 8) {
      __assert_fail("self->state->element_size == UINT64_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6d1,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    goto LAB_00135f24;
  case '\x05':
    if (paVar3->scalar_storage_type != '\x01') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6d5,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 1) {
      __assert_fail("self->state->element_size == INT8_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6d6,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    break;
  case '\x06':
    if (paVar3->scalar_storage_type != '\x01') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6da,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 2) {
      __assert_fail("self->state->element_size == INT16_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6db,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
LAB_00135eb9:
    value = (paVar3->scalar_value).u32;
    uVar5 = '\x02';
    goto LAB_00135f4a;
  case '\a':
    if (paVar3->scalar_storage_type != '\x01') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6df,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 4) {
      __assert_fail("self->state->element_size == INT32_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6e0,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
LAB_00135ed9:
    value = (paVar3->scalar_value).u32;
    uVar5 = '\x04';
    goto LAB_00135f4a;
  case '\b':
    if (paVar3->scalar_storage_type != '\x03') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6e4,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 8) {
      __assert_fail("self->state->element_size == INT64_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6e5,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
LAB_00135f24:
    value_00 = (paVar3->scalar_value).u64;
    uVar5 = '\b';
LAB_00135f6d:
    packLE64(p,value_00,uVar5);
    goto LAB_00135f72;
  default:
    goto switchD_00135e12_caseD_9;
  case '\r':
    if (paVar3->scalar_storage_type != '\x05') {
      __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_BOOL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6e9,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    if (uVar2 != 1) {
      __assert_fail("self->state->element_size == BOOL_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x6ea,
                    "apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t *)");
    }
    value_00 = (uint64_t)(paVar3->scalar_value).bl;
    uVar5 = '\x01';
    goto LAB_00135f6d;
  }
  value = (paVar3->scalar_value).u32;
  uVar5 = '\x01';
LAB_00135f4a:
  packLE(p,value,uVar5);
LAB_00135f72:
  aVar4 = 0;
switchD_00135e12_caseD_9:
  ppuVar1 = &(self->buffer).next;
  *ppuVar1 = *ppuVar1 + self->state->element_size;
  return aVar4;
}

Assistant:

static apx_error_t serializer_pack_scalar_value_internal(apx_vm_serializer_t* self)
{
   assert(self != NULL);
   apx_error_t retval = APX_NO_ERROR;
   if ((self->buffer.next + self->state->element_size) <= self->buffer.end)
   {
      switch (self->state->type_code)
      {
      case APX_TYPE_CODE_UINT8:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32);
         assert(self->state->element_size == UINT8_SIZE);
         packLE(self->buffer.next, self->state->scalar_value.u32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_UINT16:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32);
         assert(self->state->element_size == UINT16_SIZE);
         packLE(self->buffer.next, self->state->scalar_value.u32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_UINT32:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT32);
         assert(self->state->element_size == UINT32_SIZE);
         packLE(self->buffer.next, self->state->scalar_value.u32, (uint8_t) self->state->element_size);
         break;
      case APX_TYPE_CODE_UINT64:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_UINT64);
         assert(self->state->element_size == UINT64_SIZE);
         packLE64(self->buffer.next, self->state->scalar_value.u64, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT8:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
         assert(self->state->element_size == INT8_SIZE);
         packLE(self->buffer.next, (uint32_t) self->state->scalar_value.i32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT16:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
         assert(self->state->element_size == INT16_SIZE);
         packLE(self->buffer.next, (uint32_t)self->state->scalar_value.i32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT32:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
         assert(self->state->element_size == INT32_SIZE);
         packLE(self->buffer.next, (uint32_t)self->state->scalar_value.i32, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_INT64:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64);
         assert(self->state->element_size == INT64_SIZE);
         packLE64(self->buffer.next, (uint64_t)self->state->scalar_value.i64, (uint8_t)self->state->element_size);
         break;
      case APX_TYPE_CODE_BOOL:
         assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_BOOL);
         assert(self->state->element_size == BOOL_SIZE);
         packLE64(self->buffer.next, self->state->scalar_value.bl? 1u : 0u, (uint8_t)self->state->element_size);
         break;
      default:
         retval = APX_UNSUPPORTED_ERROR;
      }
      self->buffer.next += self->state->element_size;
   }
   else
   {
      retval = APX_BUFFER_BOUNDARY_ERROR;
   }
   return retval;

}